

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::FunctionalBindSamplersTest::iterate(FunctionalBindSamplersTest *this)

{
  pointer *this_00;
  value_type vVar1;
  code *pcVar2;
  Context *pCVar3;
  char cVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar10;
  TestContext *pTVar11;
  TestLog *this_01;
  MessageBuilder *pMVar12;
  TestError *this_02;
  Enum<int,_2UL> EVar13;
  exception *anon_var_0;
  string local_308;
  GLuint local_2e4;
  GetNameFunc p_Stack_2e0;
  GLint i_6;
  int local_2d8;
  Enum<int,_2UL> local_2d0;
  GetNameFunc local_2c0;
  int local_2b8;
  Enum<int,_2UL> local_2b0;
  int local_29c;
  MessageBuilder local_298;
  int local_114;
  int local_110;
  GLenum generated_error;
  GLint i_5;
  GLuint local_e8;
  allocator<char> local_e1;
  GLint i_4;
  GLuint local_c0;
  allocator<char> local_b9;
  GLint i_3;
  GLuint local_94;
  GLuint local_90;
  GLint i_2;
  GLint half_index;
  GLuint local_64;
  int local_60;
  GLint i_1;
  GLint i;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> t_sampler_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sampler_ids;
  GLint max_samplers;
  GLuint invalid_id;
  Functions *gl;
  FunctionalBindSamplersTest *this_local;
  long lVar9;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar8->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  (**(code **)(lVar9 + 0x868))
            (0x8b4d,&sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb60);
  this_00 = &t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
             (long)(int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
             (long)(int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  for (local_60 = 0;
      iVar5 = (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
      local_60 <
      (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; local_60 = local_60 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                         (long)local_60);
    *pvVar10 = 0;
  }
  pcVar2 = *(code **)(lVar9 + 0x6f0);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &t_sampler_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(iVar5,pvVar10);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"GenSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb70);
  iVar5 = (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  pcVar2 = *(code **)(lVar9 + 0xb0);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &t_sampler_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(0,iVar5,pvVar10);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb78);
  for (local_64 = 0; GVar7 = local_64,
      (int)local_64 <
      (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; local_64 = local_64 + 1) {
    pCVar3 = (this->super_TestCase).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&half_index,"Sampler",(allocator<char> *)((long)&i_2 + 3));
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &t_sampler_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(int)local_64);
    checkBinding(pCVar3,0x8919,GVar7,(string *)&half_index,*pvVar10);
    std::__cxx11::string::~string((string *)&half_index);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_2 + 3));
  }
  GVar7 = (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage / 2;
  pcVar2 = *(code **)(lVar9 + 0xb0);
  local_90 = GVar7;
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
  (*pcVar2)(0,GVar7,pvVar10);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb86);
  for (local_94 = 0; GVar7 = local_94, (int)local_94 < (int)local_90; local_94 = local_94 + 1) {
    pCVar3 = (this->super_TestCase).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_3,"Sampler",&local_b9);
    checkBinding(pCVar3,0x8919,GVar7,(string *)&i_3,0);
    std::__cxx11::string::~string((string *)&i_3);
    std::allocator<char>::~allocator(&local_b9);
  }
  for (local_c0 = local_90; GVar7 = local_c0,
      (int)local_c0 <
      (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; local_c0 = local_c0 + 1) {
    pCVar3 = (this->super_TestCase).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_4,"Sampler",&local_e1);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &t_sampler_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(int)local_c0);
    checkBinding(pCVar3,0x8919,GVar7,(string *)&i_4,*pvVar10);
    std::__cxx11::string::~string((string *)&i_4);
    std::allocator<char>::~allocator(&local_e1);
  }
  (**(code **)(lVar9 + 0xb0))
            (local_90,(int)sampler_ids.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage - local_90,0);
  dVar6 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar6,"BindSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0xb97);
  for (local_e8 = 0; GVar7 = local_e8,
      (int)local_e8 <
      (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; local_e8 = local_e8 + 1) {
    pCVar3 = (this->super_TestCase).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_5,"Sampler",(allocator<char> *)((long)&generated_error + 3));
    checkBinding(pCVar3,0x8919,GVar7,(string *)&i_5,0);
    std::__cxx11::string::~string((string *)&i_5);
    std::allocator<char>::~allocator((allocator<char> *)((long)&generated_error + 3));
  }
  while (cVar4 = (**(code **)(lVar9 + 0xcb0))
                           (sampler_ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_),
        vVar1 = sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_, cVar4 == '\x01') {
    sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
  *pvVar10 = vVar1;
  for (local_110 = 1;
      iVar5 = (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
      local_110 <
      (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage; local_110 = local_110 + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &t_sampler_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)local_110);
    vVar1 = *pvVar10;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                         (long)local_110);
    *pvVar10 = vVar1;
  }
  pcVar2 = *(code **)(lVar9 + 0xb0);
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
  (*pcVar2)(0,iVar5,pvVar10);
  local_114 = (**(code **)(lVar9 + 0x800))();
  if (local_114 == 0x502) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0);
    *pvVar10 = 0;
    for (local_2e4 = 0; GVar7 = local_2e4,
        (int)local_2e4 <
        (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage; local_2e4 = local_2e4 + 1) {
      pCVar3 = (this->super_TestCase).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"Sampler",(allocator<char> *)((long)&anon_var_0 + 7));
      pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                           (long)(int)local_2e4);
      checkBinding(pCVar3,0x8919,GVar7,&local_308,*pvVar10);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    (**(code **)(lVar9 + 0xb0))
              (0,(int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    dVar6 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar6,"BindSamplers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0xbc5);
    iVar5 = (int)sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
    pcVar2 = *(code **)(lVar9 + 0x468);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    (*pcVar2)(iVar5);
    pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar11,QP_TEST_RESULT_PASS,"Pass");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &t_sampler_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    return STOP;
  }
  pTVar11 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(pTVar11);
  tcu::TestLog::operator<<(&local_298,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar12 = tcu::MessageBuilder::operator<<(&local_298,(char (*) [7])0x2a372b5);
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                      );
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [9])", line: ");
  local_29c = 0xbb9;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_29c);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [20])". Got wrong error: ");
  EVar13 = glu::getErrorStr(local_114);
  local_2c0 = EVar13.m_getName;
  local_2b8 = EVar13.m_value;
  local_2b0.m_getName = local_2c0;
  local_2b0.m_value = local_2b8;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_2b0);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [13])0x2a22899);
  EVar13 = glu::getErrorStr(0x502);
  p_Stack_2e0 = EVar13.m_getName;
  local_2d8 = EVar13.m_value;
  local_2d0.m_getName = p_Stack_2e0;
  local_2d0.m_value = local_2d8;
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_2d0);
  pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [12])", message: ");
  pMVar12 = tcu::MessageBuilder::operator<<
                      (pMVar12,(char (*) [37])"BindSamplers with invalid sampler id");
  tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_298);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0xbb9);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalBindSamplersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLuint invalid_id   = 1; /* Start with 1, as 0 is not valid name */
	GLint  max_samplers = 0;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_samplers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Storage */
	std::vector<GLuint> sampler_ids;
	std::vector<GLuint> t_sampler_ids;

	sampler_ids.resize(max_samplers);
	t_sampler_ids.resize(max_samplers);

	for (GLint i = 0; i < max_samplers; ++i)
	{
		t_sampler_ids[i] = 0;
	}

	/* Prepare samplers */
	gl.genSamplers(max_samplers, &sampler_ids[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenSamplers");

	try
	{
		/* - execute BindSamplers to bind all samplers;
		 * - inspect bindings to verify that proper samplers were set;
		 */
		gl.bindSamplers(0 /* first */, max_samplers /* count */, &sampler_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", sampler_ids[i]);
		}

		/* - execute BindSamplers for first half of bindings with <samplers> filled
		 * with zeros, to unbind those samplers;
		 * - inspect bindings to verify that proper samplers were unbound;
		 */
		GLint half_index = max_samplers / 2;

		gl.bindSamplers(0, half_index, &t_sampler_ids[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < half_index; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", 0);
		}

		for (GLint i = half_index; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", sampler_ids[i]);
		}

		/* - execute BindSamplers for second half of bindings with NULL as <samplers>,
		 * to unbind those samplers;
		 * - inspect bindings to verify that proper samplers were unbound;
		 */
		gl.bindSamplers(half_index, max_samplers - half_index, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", 0);
		}

		/* - modify <samplers> so first entry is invalid;
		 * - execute BindSamplers to bind all samplers; It is expected that
		 * INVALID_OPERATION will be generated;
		 * - inspect bindings to verify that proper samplers were set;
		 */

		/* Find invalid id */
		while (1)
		{
			if (GL_TRUE != gl.isSampler(invalid_id))
			{
				break;
			}

			invalid_id += 1;
		}

		/* Prepare ids */
		t_sampler_ids[0] = invalid_id;

		for (GLint i = 1; i < max_samplers; ++i)
		{
			t_sampler_ids[i] = sampler_ids[i];
		}

		/* Bind */
		gl.bindSamplers(0, max_samplers, &t_sampler_ids[0]);
		CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid sampler id");

		/* Set 0 for invalid entry */
		t_sampler_ids[0] = 0;

		for (GLint i = 0; i < max_samplers; ++i)
		{
			checkBinding(m_context, GL_SAMPLER_BINDING, i, "Sampler", t_sampler_ids[i]);
		}

		/* - unbind all samplers. */
		gl.bindSamplers(0, max_samplers, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindSamplers");
	}
	catch (const std::exception&)
	{
		gl.deleteSamplers(max_samplers, &sampler_ids[0]);

		TCU_FAIL("Invalid error generated");
	}

	/* Delete samplers */
	gl.deleteSamplers(max_samplers, &sampler_ids[0]);

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}